

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void get_rate_distortion(int *rate_cost,int64_t *recon_error,int64_t *pred_error,int16_t *src_diff,
                        tran_low_t *coeff,tran_low_t *qcoeff,tran_low_t *dqcoeff,AV1_COMMON *cm,
                        MACROBLOCK *x,YV12_BUFFER_CONFIG **ref_frame_ptr,uint8_t **rec_buffer_pool,
                        int *rec_stride_pool,TX_SIZE tx_size,PREDICTION_MODE best_mode,int mi_row,
                        int mi_col,int use_y_only_rate_distortion,int do_recon,
                        TplTxfmStats *tpl_txfm_stats)

{
  ulong uVar1;
  int iVar2;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  MV *in_R8;
  ulong in_R9;
  uint8_t *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  byte in_stack_00000038;
  PREDICTION_MODE in_stack_00000040;
  int in_stack_00000048;
  int in_stack_00000050;
  int in_stack_00000058;
  int in_stack_00000060;
  int64_t sse;
  int64_t this_recon_error;
  int this_rate;
  int src_mb_offset;
  int src_stride;
  buf_2d ref_buf;
  InterPredParams inter_pred_params;
  uint8_t *ref_buffer_pool [3];
  int_mv best_mv;
  int ref;
  uint8_t *dst_buffer;
  int dst_mb_offset;
  int dst_buffer_stride;
  BLOCK_SIZE bsize_plane;
  macroblockd_plane *pd;
  int plane;
  int_interpfilters kernel;
  int src_stride_pool [3];
  uint8_t *src_buffer_pool [3];
  int num_planes;
  int is_compound;
  MACROBLOCKD *xd;
  SequenceHeader *seq_params;
  int iVar3;
  undefined4 in_stack_fffffffffffffd0c;
  MV *in_stack_fffffffffffffd10;
  undefined4 uVar4;
  ulong in_stack_fffffffffffffd18;
  uint dst_stride;
  uint8_t *in_stack_fffffffffffffd20;
  uint8_t *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  int *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd60;
  MV *in_stack_fffffffffffffd68;
  int16_t *in_stack_fffffffffffffd70;
  tran_low_t *in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  undefined4 local_26c;
  undefined4 *in_stack_fffffffffffffd98;
  TX_SIZE in_stack_fffffffffffffda0;
  undefined4 local_25c;
  undefined4 *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  int64_t *in_stack_fffffffffffffdb8;
  int64_t *in_stack_fffffffffffffdc0;
  long local_238;
  int local_22c;
  int local_228;
  int local_224;
  ConvolveParams local_220;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8 [5];
  TX_SIZE in_stack_fffffffffffffe3f;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  BLOCK_SIZE in_stack_fffffffffffffe4f;
  MACROBLOCKD *in_stack_fffffffffffffe50;
  tran_low_t atStack_1a0 [12];
  PREDICTION_MODE in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  FILTER_INTRA_MODE in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  uint8_t *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  undefined8 local_f8 [4];
  int_mv local_d8;
  int local_d4;
  uint8_t *local_d0;
  int local_c4;
  int local_c0;
  BLOCK_SIZE local_b9;
  macroblockd_plane *local_b8;
  int local_ac;
  int_interpfilters local_a8;
  int local_a4 [3];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_78;
  uint local_74;
  MACROBLOCKD *local_70;
  undefined8 local_68;
  ulong local_60;
  MV *local_58;
  long *local_48;
  long *local_40;
  int *local_38;
  
  local_68 = *(undefined8 *)(in_stack_00000010 + 0x6088);
  *in_RDI = 0;
  *in_RSI = 1;
  *in_RDX = 1;
  local_70 = (MACROBLOCKD *)(in_stack_00000018 + 0x1a0);
  local_74 = (uint)(in_stack_00000040 == '\x18');
  local_78 = 3;
  if (in_stack_00000058 != 0) {
    local_78 = 1;
  }
  local_98 = *(undefined8 *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x28);
  local_90 = *(undefined8 *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x30);
  local_88 = *(undefined8 *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x38);
  local_a4[0] = *(int *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x20);
  local_a4[1] = *(undefined4 *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x24);
  local_a4[2] = *(undefined4 *)(*(long *)(in_stack_00000018 + 0x20b8) + 0x24);
  local_60 = in_R9;
  local_58 = in_R8;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_a8 = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
  for (local_ac = 0; local_ac < local_78; local_ac = local_ac + 1) {
    local_b8 = local_70->plane + local_ac;
    local_b9 = av1_ss_size_lookup[txsize_to_bsize[in_stack_00000038]][local_b8->subsampling_x]
               [local_b8->subsampling_y];
    local_c0 = *(int *)(in_stack_00000030 + (long)local_ac * 4);
    local_c4 = (in_stack_00000048 * 4 * local_c0 >> ((byte)local_b8->subsampling_y & 0x1f)) +
               ((in_stack_00000050 << 2) >> ((byte)local_b8->subsampling_x & 0x1f));
    local_d0 = (uint8_t *)(*(long *)(in_stack_00000028 + (long)local_ac * 8) + (long)local_c4);
    for (local_d4 = 0; uVar1 = local_60, iVar3 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
        local_d4 < (int)(local_74 + 1); local_d4 = local_d4 + 1) {
      iVar2 = is_inter_mode(in_stack_00000040);
      uVar4 = (undefined4)((ulong)in_stack_fffffffffffffd10 >> 0x20);
      if (iVar2 == 0) {
        in_stack_fffffffffffffd10 = (MV *)((ulong)in_stack_fffffffffffffd10 & 0xffffffff00000000);
        in_stack_fffffffffffffd18 = in_stack_fffffffffffffd18 & 0xffffffff00000000;
        in_stack_fffffffffffffd20 =
             (uint8_t *)CONCAT44((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),5);
        in_stack_fffffffffffffd48 = (int *)((ulong)in_stack_fffffffffffffd48 & 0xffffffff00000000);
        in_stack_fffffffffffffd38 = local_d0;
        in_stack_fffffffffffffd40 = local_c0;
        av1_predict_intra_block
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,
                   in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
      }
      else {
        local_d8 = (*local_70->mi)->mv[local_d4];
        local_f8[0] = *(undefined8 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0x28);
        local_f8[1] = *(undefined8 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0x30);
        local_f8[2] = *(undefined8 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0x38);
        local_1f0 = 0;
        local_1e8 = local_f8[local_ac];
        in_stack_fffffffffffffdb8 = (int64_t *)&local_1e0;
        if (local_ac == 0) {
          in_stack_fffffffffffffdb4 = **(undefined4 **)(in_stack_00000020 + (long)local_d4 * 8);
        }
        else {
          in_stack_fffffffffffffdb4 =
               *(undefined4 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 4);
        }
        in_stack_fffffffffffffda8 = &local_1dc;
        if (local_ac == 0) {
          local_25c = *(undefined4 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 8);
        }
        else {
          local_25c = *(undefined4 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0xc);
        }
        local_1dc = local_25c;
        in_stack_fffffffffffffd98 = local_1d8;
        if (local_ac == 0) {
          local_26c = *(undefined4 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0x20);
        }
        else {
          local_26c = *(undefined4 *)(*(long *)(in_stack_00000020 + (long)local_d4 * 8) + 0x24);
        }
        local_1d8[0] = local_26c;
        in_stack_fffffffffffffd80 = (uint)block_size_wide[local_b9];
        in_stack_fffffffffffffd84 = (uint)block_size_high[local_b9];
        in_stack_fffffffffffffd88 =
             (in_stack_00000048 << 2) >> ((byte)local_b8->subsampling_y & 0x1f);
        in_stack_fffffffffffffd8c =
             (in_stack_00000050 << 2) >> ((byte)local_b8->subsampling_x & 0x1f);
        in_stack_fffffffffffffd90 = local_b8->subsampling_x;
        iVar2 = local_70->bd;
        local_1e0 = in_stack_fffffffffffffdb4;
        is_cur_buf_hbd(local_70);
        in_stack_fffffffffffffd10 = (MV *)CONCAT44(uVar4,iVar2);
        dst_stride = (uint)(in_stack_fffffffffffffd18 >> 0x20);
        in_stack_fffffffffffffd18 = (ulong)dst_stride << 0x20;
        in_stack_fffffffffffffd20 =
             (uint8_t *)((ulong)in_stack_fffffffffffffd20 & 0xffffffff00000000);
        in_stack_fffffffffffffd38 = (uint8_t *)CONCAT44(iVar3,local_a8.as_int);
        av1_init_inter_params
                  ((InterPredParams *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   iVar3,local_a8.as_int,(int)((ulong)&local_1f0 >> 0x20),(int)&local_1f0,
                   (int)((ulong)local_70->block_ref_scale_factors[0] >> 0x20),
                   in_stack_fffffffffffffd60,(int)in_stack_fffffffffffffd68,
                   (int)in_stack_fffffffffffffd70,(int)in_stack_fffffffffffffd78,
                   (scale_factors *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (buf_2d *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   (int_interpfilters)(uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        if (local_74 != 0) {
          av1_init_comp_mode((InterPredParams *)(local_1d8 + 2));
        }
        in_stack_fffffffffffffd78 = atStack_1a0;
        iVar3 = local_70->bd;
        get_conv_params_no_round
                  (&local_220,local_d4,local_ac,local_70->tmp_conv_dst,0x80,local_74,iVar3);
        memcpy(in_stack_fffffffffffffd78,&local_220,0x30);
        av1_enc_build_one_inter_predictor
                  (in_stack_fffffffffffffd20,dst_stride,in_stack_fffffffffffffd10,
                   (InterPredParams *)CONCAT44(in_stack_fffffffffffffd0c,iVar3));
      }
    }
    local_224 = local_a4[local_ac];
    local_228 = (in_stack_00000048 * 4 * local_224 >> ((byte)local_b8->subsampling_y & 0x1f)) +
                ((in_stack_00000050 << 2) >> ((byte)local_b8->subsampling_x & 0x1f));
    local_22c = 1;
    local_238 = 1;
    in_stack_fffffffffffffd48 = &local_22c;
    in_stack_fffffffffffffd70 = (int16_t *)&stack0xfffffffffffffdc0;
    in_stack_fffffffffffffd38 = (uint8_t *)CONCAT44(iVar3,(uint)""[local_b9]);
    in_stack_fffffffffffffd10 = local_58;
    in_stack_fffffffffffffd20 = in_stack_00000008;
    in_stack_fffffffffffffd40 = in_stack_00000060;
    in_stack_fffffffffffffd68 = local_58;
    txfm_quant_rdcost((MACROBLOCK *)CONCAT44(local_c0,in_stack_fffffffffffffd60),
                      in_stack_fffffffffffffd70,(int)((ulong)&local_238 >> 0x20),
                      (uint8_t *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
                      in_stack_fffffffffffffd38,(int)in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd78,
                      (tran_low_t *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (tran_low_t *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                      in_stack_fffffffffffffd90,(int)in_stack_fffffffffffffd98,
                      in_stack_fffffffffffffda0,(int)in_stack_fffffffffffffda8,
                      (int *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      in_stack_fffffffffffffdb8,in_stack_fffffffffffffdc0);
    *local_40 = local_238 + *local_40;
    *local_48 = (long)in_stack_fffffffffffffdc0 + *local_48;
    *local_38 = local_22c + *local_38;
    in_stack_fffffffffffffd18 = uVar1;
  }
  return;
}

Assistant:

static void get_rate_distortion(
    int *rate_cost, int64_t *recon_error, int64_t *pred_error,
    int16_t *src_diff, tran_low_t *coeff, tran_low_t *qcoeff,
    tran_low_t *dqcoeff, AV1_COMMON *cm, MACROBLOCK *x,
    const YV12_BUFFER_CONFIG *ref_frame_ptr[2], uint8_t *rec_buffer_pool[3],
    const int rec_stride_pool[3], TX_SIZE tx_size, PREDICTION_MODE best_mode,
    int mi_row, int mi_col, int use_y_only_rate_distortion, int do_recon,
    TplTxfmStats *tpl_txfm_stats) {
  const SequenceHeader *seq_params = cm->seq_params;
  *rate_cost = 0;
  *recon_error = 1;
  *pred_error = 1;

  (void)tpl_txfm_stats;

  MACROBLOCKD *xd = &x->e_mbd;
  int is_compound = (best_mode == NEW_NEWMV);
  int num_planes = use_y_only_rate_distortion ? 1 : MAX_MB_PLANE;

  uint8_t *src_buffer_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_buffer,
    xd->cur_buf->u_buffer,
    xd->cur_buf->v_buffer,
  };
  const int src_stride_pool[MAX_MB_PLANE] = {
    xd->cur_buf->y_stride,
    xd->cur_buf->uv_stride,
    xd->cur_buf->uv_stride,
  };

  const int_interpfilters kernel =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  for (int plane = 0; plane < num_planes; ++plane) {
    struct macroblockd_plane *pd = &xd->plane[plane];
    BLOCK_SIZE bsize_plane =
        av1_ss_size_lookup[txsize_to_bsize[tx_size]][pd->subsampling_x]
                          [pd->subsampling_y];

    int dst_buffer_stride = rec_stride_pool[plane];
    int dst_mb_offset =
        ((mi_row * MI_SIZE * dst_buffer_stride) >> pd->subsampling_y) +
        ((mi_col * MI_SIZE) >> pd->subsampling_x);
    uint8_t *dst_buffer = rec_buffer_pool[plane] + dst_mb_offset;
    for (int ref = 0; ref < 1 + is_compound; ++ref) {
      if (!is_inter_mode(best_mode)) {
        av1_predict_intra_block(
            xd, seq_params->sb_size, seq_params->enable_intra_edge_filter,
            block_size_wide[bsize_plane], block_size_high[bsize_plane],
            max_txsize_rect_lookup[bsize_plane], best_mode, 0, 0,
            FILTER_INTRA_MODES, dst_buffer, dst_buffer_stride, dst_buffer,
            dst_buffer_stride, 0, 0, plane);
      } else {
        int_mv best_mv = xd->mi[0]->mv[ref];
        uint8_t *ref_buffer_pool[MAX_MB_PLANE] = {
          ref_frame_ptr[ref]->y_buffer,
          ref_frame_ptr[ref]->u_buffer,
          ref_frame_ptr[ref]->v_buffer,
        };
        InterPredParams inter_pred_params;
        struct buf_2d ref_buf = {
          NULL, ref_buffer_pool[plane],
          plane ? ref_frame_ptr[ref]->uv_width : ref_frame_ptr[ref]->y_width,
          plane ? ref_frame_ptr[ref]->uv_height : ref_frame_ptr[ref]->y_height,
          plane ? ref_frame_ptr[ref]->uv_stride : ref_frame_ptr[ref]->y_stride
        };
        av1_init_inter_params(&inter_pred_params, block_size_wide[bsize_plane],
                              block_size_high[bsize_plane],
                              (mi_row * MI_SIZE) >> pd->subsampling_y,
                              (mi_col * MI_SIZE) >> pd->subsampling_x,
                              pd->subsampling_x, pd->subsampling_y, xd->bd,
                              is_cur_buf_hbd(xd), 0,
                              xd->block_ref_scale_factors[0], &ref_buf, kernel);
        if (is_compound) av1_init_comp_mode(&inter_pred_params);
        inter_pred_params.conv_params = get_conv_params_no_round(
            ref, plane, xd->tmp_conv_dst, MAX_SB_SIZE, is_compound, xd->bd);

        av1_enc_build_one_inter_predictor(dst_buffer, dst_buffer_stride,
                                          &best_mv.as_mv, &inter_pred_params);
      }
    }

    int src_stride = src_stride_pool[plane];
    int src_mb_offset = ((mi_row * MI_SIZE * src_stride) >> pd->subsampling_y) +
                        ((mi_col * MI_SIZE) >> pd->subsampling_x);

    int this_rate = 1;
    int64_t this_recon_error = 1;
    int64_t sse;
    txfm_quant_rdcost(
        x, src_diff, block_size_wide[bsize_plane],
        src_buffer_pool[plane] + src_mb_offset, src_stride, dst_buffer,
        dst_buffer_stride, coeff, qcoeff, dqcoeff, block_size_wide[bsize_plane],
        block_size_high[bsize_plane], max_txsize_rect_lookup[bsize_plane],
        do_recon, &this_rate, &this_recon_error, &sse);

#if CONFIG_BITRATE_ACCURACY
    if (plane == 0 && tpl_txfm_stats) {
      // We only collect Y plane's transform coefficient
      av1_record_tpl_txfm_block(tpl_txfm_stats, coeff);
    }
#endif  // CONFIG_BITRATE_ACCURACY

    *recon_error += this_recon_error;
    *pred_error += sse;
    *rate_cost += this_rate;
  }
}